

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O1

void __thiscall Assimp::ExporterPimpl::~ExporterPimpl(ExporterPimpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  aiExportDataBlob *this_00;
  pointer pEVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  pointer ppBVar5;
  ulong uVar6;
  ulong uVar7;
  
  this_00 = this->blob;
  if (this_00 != (aiExportDataBlob *)0x0) {
    aiExportDataBlob::~aiExportDataBlob(this_00);
    operator_delete(this_00,0x420);
  }
  ppBVar5 = (this->mPostProcessingSteps).
            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mPostProcessingSteps).
      super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      if (ppBVar5[uVar6] != (BaseProcess *)0x0) {
        (*ppBVar5[uVar6]->_vptr_BaseProcess[1])();
      }
      ppBVar5 = (this->mPostProcessingSteps).
                super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar7 < (ulong)((long)(this->mPostProcessingSteps).
                                    super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar5 >> 3)
      ;
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  if (this->mProgressHandler != (ProgressHandler *)0x0) {
    (*this->mProgressHandler->_vptr_ProgressHandler[1])();
  }
  pEVar2 = (this->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2,(long)(this->mExporters).
                                 super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar2);
  }
  pcVar3 = (this->mError)._M_dataplus._M_p;
  paVar1 = &(this->mError).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ppBVar5 = (this->mPostProcessingSteps).
            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar5 != (pointer)0x0) {
    operator_delete(ppBVar5,(long)(this->mPostProcessingSteps).
                                  super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar5
                   );
  }
  this_01 = (this->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    return;
  }
  return;
}

Assistant:

~ExporterPimpl() {
        delete blob;

        // Delete all post-processing plug-ins
        for( unsigned int a = 0; a < mPostProcessingSteps.size(); a++) {
            delete mPostProcessingSteps[a];
        }
        delete mProgressHandler;
    }